

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O0

void PatchHandleArchipelago::add_proc_init_archipelago_ground_items(ROM *rom)

{
  size_t sVar1;
  uint32_t uVar2;
  Code *code;
  Code local_408;
  allocator<char> local_389;
  string local_388;
  uint32_t local_368;
  allocator<char> local_361;
  uint32_t func_addr;
  allocator<char> local_339;
  string local_338;
  AddressRegister local_318;
  AddressInRegister local_308;
  AddressRegister local_2e8;
  AddressInRegister local_2d8;
  AddressRegister local_2b8;
  AddressInRegister local_2a8;
  DataRegister local_288;
  allocator<char> local_271;
  string local_270;
  DataRegister local_250;
  allocator<char> local_239;
  string local_238;
  DataRegister local_218;
  AddressRegister local_208;
  AddressInRegister local_1f8;
  DataRegister local_1d8;
  DataRegister local_1c8;
  DataRegister local_1b8;
  AddressRegister local_1a8;
  AddressInRegister local_198;
  DataRegister local_178;
  AddressRegister local_168;
  AddressInRegister local_158;
  AddressRegister local_138;
  AddressInRegister local_128;
  allocator<char> local_101;
  string local_100;
  DataRegister local_e0;
  allocator<char> local_c9;
  string local_c8;
  DataRegister local_98;
  undefined1 local_88 [8];
  Code func;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::DataRegister::DataRegister(&local_98,'\0');
  md::Code::cmpib((Code *)local_88,0xc0,(Param *)&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"regular_item_entity",&local_c9);
  md::Code::bcc((Code *)local_88,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  md::DataRegister::DataRegister(&local_e0,'\0');
  md::Code::cmpib((Code *)local_88,'X',(Param *)&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"not_an_item",&local_101);
  md::Code::bne((Code *)local_88,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  md::AddressRegister::AddressRegister(&local_138,'\x01');
  addr_<int>(&local_128,&local_138,0xb);
  md::Code::moveb((Code *)local_88,'#',&local_128.super_Param);
  md::AddressRegister::AddressRegister(&local_168,'\x01');
  addr_<int>(&local_158,&local_168,0x36);
  md::Code::moveb((Code *)local_88,'\x7f',&local_158.super_Param);
  md::DataRegister::DataRegister(&local_178,'\x02');
  md::Code::clrw((Code *)local_88,(Param *)&local_178);
  md::AddressRegister::AddressRegister(&local_1a8,'\x02');
  addr_<int>(&local_198,&local_1a8,0xfffe);
  md::DataRegister::DataRegister(&local_1b8,'\x02');
  md::Code::moveb((Code *)local_88,&local_198.super_Param,(Param *)&local_1b8);
  md::DataRegister::DataRegister(&local_1c8,'\x02');
  md::Code::andib((Code *)local_88,'\x03',(Param *)&local_1c8);
  md::DataRegister::DataRegister(&local_1d8,'\x02');
  md::Code::lslw((Code *)local_88,'\b',&local_1d8);
  md::AddressRegister::AddressRegister(&local_208,'\x02');
  addr_<int>(&local_1f8,&local_208,1);
  md::DataRegister::DataRegister(&local_218,'\x02');
  md::Code::moveb((Code *)local_88,&local_1f8.super_Param,(Param *)&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"not_zero",&local_239);
  md::Code::bne((Code *)local_88,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  md::DataRegister::DataRegister(&local_250,'\x02');
  md::Code::movew((Code *)local_88,2,(Param *)&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"not_zero",&local_271);
  md::Code::label((Code *)local_88,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  md::DataRegister::DataRegister(&local_288,'\x02');
  md::AddressRegister::AddressRegister(&local_2b8,'\x01');
  addr_<int>(&local_2a8,&local_2b8,0x34);
  md::Code::movew((Code *)local_88,(Param *)&local_288,&local_2a8.super_Param);
  md::AddressRegister::AddressRegister(&local_2e8,'\x01');
  addr_<int>(&local_2d8,&local_2e8,0x25);
  md::Code::moveb((Code *)local_88,'\x1c',&local_2d8.super_Param);
  md::AddressRegister::AddressRegister(&local_318,'\x01');
  addr_<int>(&local_308,&local_318,0x27);
  md::Code::moveb((Code *)local_88,'\x1c',&local_308.super_Param);
  md::Code::jmp((Code *)local_88,0x196fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"not_an_item",&local_339);
  md::Code::label((Code *)local_88,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  md::Code::jmp((Code *)local_88,0x1972a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_addr,"regular_item_entity",&local_361);
  md::Code::label((Code *)local_88,(string *)&func_addr);
  std::__cxx11::string::~string((string *)&func_addr);
  std::allocator<char>::~allocator(&local_361);
  md::Code::jmp((Code *)local_88,0x19638);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"",&local_389);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_88,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408._labels._M_t._M_impl._0_8_ = 0;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_408._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_408._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._pending_branches._M_t._M_impl._0_8_ = 0;
  local_408._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_408._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_368 = uVar2;
  md::Code::Code(&local_408);
  code = md::Code::jmp(&local_408,local_368);
  md::ROM::set_code((ROM *)sVar1,0x19630,code);
  md::Code::~Code(&local_408);
  md::Code::~Code((Code *)local_88);
  return;
}

Assistant:

static void add_proc_init_archipelago_ground_items(md::ROM& rom)
    {
        md::Code func;
        {
            func.cmpib(0xC0, reg_D0);
            func.bcc("regular_item_entity");
            {
                func.cmpib(ENTITY_ARCHIPELAGO_ITEM, reg_D0);
                func.bne("not_an_item");
                {
                    func.moveb(0x23, addr_(reg_A1, 0x0B));
                    func.moveb(ITEM_ARCHIPELAGO, addr_(reg_A1, 0x36));  // Contents value

                    // Apply custom behavior, or 0x0002 if none was specified
                    func.clrw(reg_D2);
                    func.moveb(addr_(reg_A2, 0xFFFE), reg_D2);
                    func.andib(0x03, reg_D2);
                    func.lslw(0x08, reg_D2);
                    func.moveb(addr_(reg_A2, 0x01), reg_D2);
                    func.bne("not_zero");
                    {
                        func.movew(0x0002, reg_D2);
                    }
                    func.label("not_zero");
                    func.movew(reg_D2, addr_(reg_A1, 0x34));

                    func.moveb(0x1C, addr_(reg_A1, 0x25));              // Sprite (animation)
                    func.moveb(0x1C, addr_(reg_A1, 0x27));              // Sprite (frame)
                    func.jmp(0x196FA);
                }
                func.label("not_an_item");
                func.jmp(0x1972A);
            }
            func.label("regular_item_entity");
            func.jmp(0x19638);
        }

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x19630, md::Code().jmp(func_addr));
    }